

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pbrt::SphericalCamera::GenerateRay
          (SphericalCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  float fVar1;
  float *pfVar2;
  long in_RSI;
  Tuple2<pbrt::Point2,_float> in_RDI;
  Float FVar3;
  double dVar4;
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  Vector3f VVar9;
  Ray ray;
  Float phi;
  Float theta;
  Vector3f dir;
  Point2f uv;
  float in_stack_fffffffffffffea8;
  Float in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  CameraBase *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  Tuple2<pbrt::Point2,_float> this_00;
  Float in_stack_fffffffffffffed8;
  Point2f *in_stack_ffffffffffffff00;
  undefined8 local_3c;
  float local_34;
  Tuple2<pbrt::Point2,_int> local_30;
  Tuple2<pbrt::Point2,_int> local_28;
  undefined8 local_20;
  undefined1 extraout_var [56];
  
  this_00 = in_RDI;
  local_28 = (Tuple2<pbrt::Point2,_int>)
             FilmHandle::FullResolution
                       ((FilmHandle *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
  ;
  local_30 = (Tuple2<pbrt::Point2,_int>)
             FilmHandle::FullResolution
                       ((FilmHandle *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8))
  ;
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  Vector3<float>::Vector3((Vector3<float> *)0x74235c);
  if (*(int *)(in_RSI + 0x380) == 0) {
    in_stack_fffffffffffffeb8 = (CameraBase *)&stack0xffffffffffffffe0;
    pfVar2 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffffeb8,1);
    fVar1 = *pfVar2;
    Tuple2<pbrt::Point2,_float>::operator[]
              ((Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffffeb8,0);
    dVar4 = std::sin((double)(ulong)(uint)(fVar1 * 3.1415927));
    in_stack_fffffffffffffec4 = SUB84(dVar4,0);
    std::cos((double)(ulong)(uint)(fVar1 * 3.1415927));
    auVar8 = (undefined1  [56])0x0;
    VVar9 = SphericalDirection(in_stack_fffffffffffffed8,this_00.y,this_00.x);
    local_34 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar8;
    local_3c = vmovlpd_avx(auVar5._0_16_);
  }
  else {
    auVar6._0_8_ = WrapEqualAreaSquare(in_RDI);
    auVar6._8_56_ = extraout_var;
    local_20 = vmovlpd_avx(auVar6._0_16_);
    auVar8 = extraout_var;
    VVar9 = EqualAreaSquareToSphere(in_stack_ffffffffffffff00);
    local_34 = VVar9.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar8;
    local_3c = vmovlpd_avx(auVar7._0_16_);
  }
  pstd::swap<float>((float *)((long)&local_3c + 4),&local_34);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeac,in_stack_fffffffffffffea8,0.0);
  FVar3 = CameraBase::SampleTime
                    ((CameraBase *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffeac);
  MediumHandle::MediumHandle
            ((MediumHandle *)CONCAT44(FVar3,in_stack_fffffffffffffeb0),
             (MediumHandle *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  Ray::Ray((Ray *)this_00,(Point3f *)in_RDI,
           (Vector3f *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
           (Float)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
           (MediumHandle *)CONCAT44(FVar3,in_stack_fffffffffffffeb0));
  CameraBase::RenderFromCamera
            (in_stack_fffffffffffffeb8,(Ray *)CONCAT44(FVar3,in_stack_fffffffffffffeb0));
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(FVar3,in_stack_fffffffffffffeb0),in_stack_fffffffffffffeac)
  ;
  pstd::optional<pbrt::CameraRay>::optional
            ((optional<pbrt::CameraRay> *)CONCAT44(FVar3,in_stack_fffffffffffffeb0),
             (CameraRay *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  return (optional<pbrt::CameraRay> *)this_00;
}

Assistant:

pstd::optional<CameraRay> SphericalCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Compute spherical camera ray direction
    Point2f uv(sample.pFilm.x / film.FullResolution().x,
               sample.pFilm.y / film.FullResolution().y);
    Vector3f dir;
    if (mapping == EquiRectangular) {
        // Compute ray direction using equirectangular mapping
        Float theta = Pi * uv[1], phi = 2 * Pi * uv[0];
        dir = SphericalDirection(std::sin(theta), std::cos(theta), phi);

    } else {
        // Compute ray direction using equal area mapping
        uv = WrapEqualAreaSquare(uv);
        dir = EqualAreaSquareToSphere(uv);
    }
    pstd::swap(dir.y, dir.z);

    Ray ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    return CameraRay{RenderFromCamera(ray)};
}